

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

int gdLayerMultiply(int dst,int src)

{
  int iVar1;
  int iVar2;
  int b2;
  int b1;
  int g2;
  int g1;
  int r2;
  int r1;
  int a2;
  int a1;
  int src_local;
  int dst_local;
  
  iVar1 = 0x7f - ((int)(src & 0x7f000000U) >> 0x18);
  iVar2 = 0x7f - ((int)(dst & 0x7f000000U) >> 0x18);
  return (((0x7f - iVar1) * (0x7f - iVar2)) / 0x7f) * 0x1000000 +
         (((0xff - (iVar1 * (0xff - ((int)(src & 0xff0000U) >> 0x10))) / 0x7f) *
          (0xff - (iVar2 * (0xff - ((int)(dst & 0xff0000U) >> 0x10))) / 0x7f)) / 0xff) * 0x10000 +
         (((0xff - (iVar1 * (0xff - ((int)(src & 0xff00U) >> 8))) / 0x7f) *
          (0xff - (iVar2 * (0xff - ((int)(dst & 0xff00U) >> 8))) / 0x7f)) / 0xff) * 0x100 +
         ((0xff - (int)(iVar1 * (0xff - (src & 0xffU))) / 0x7f) *
         (0xff - (int)(iVar2 * (0xff - (dst & 0xffU))) / 0x7f)) / 0xff;
}

Assistant:

BGD_DECLARE(int) gdLayerMultiply (int dst, int src)
{
	int a1, a2, r1, r2, g1, g2, b1, b2;
	a1 = gdAlphaMax - gdTrueColorGetAlpha(src);
	a2 = gdAlphaMax - gdTrueColorGetAlpha(dst);

	r1 = gdRedMax - (a1 * (gdRedMax - gdTrueColorGetRed(src))) / gdAlphaMax;
	r2 = gdRedMax - (a2 * (gdRedMax - gdTrueColorGetRed(dst))) / gdAlphaMax;
	g1 = gdGreenMax - (a1 * (gdGreenMax - gdTrueColorGetGreen(src))) / gdAlphaMax;
	g2 = gdGreenMax - (a2 * (gdGreenMax - gdTrueColorGetGreen(dst))) / gdAlphaMax;
	b1 = gdBlueMax - (a1 * (gdBlueMax - gdTrueColorGetBlue(src))) / gdAlphaMax;
	b2 = gdBlueMax - (a2 * (gdBlueMax - gdTrueColorGetBlue(dst))) / gdAlphaMax ;

	a1 = gdAlphaMax - a1;
	a2 = gdAlphaMax - a2;
	return ( ((a1*a2/gdAlphaMax) << 24) +
			 ((r1*r2/gdRedMax) << 16) +
			 ((g1*g2/gdGreenMax) << 8) +
			 ((b1*b2/gdBlueMax))
		);
}